

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O2

void WebPRescalerExportRowShrink_C(WebPRescaler *wrk)

{
  uint8_t *puVar1;
  rescaler_t *prVar2;
  rescaler_t *prVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  rescaler_t rVar9;
  int iVar10;
  
  puVar1 = wrk->dst;
  prVar2 = wrk->irow;
  uVar4 = wrk->num_channels * wrk->dst_width;
  iVar7 = wrk->y_accum * wrk->fy_scale;
  if (iVar7 == 0) {
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      iVar7 = (int)((ulong)wrk->fxy_scale * (ulong)prVar2[uVar8] + 0x80000000 >> 0x20);
      if (0xff < iVar7) {
        iVar7 = 0xff;
      }
      puVar1[uVar8] = (uint8_t)iVar7;
      prVar2[uVar8] = 0;
    }
  }
  else {
    prVar3 = wrk->frow;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      rVar9 = (rescaler_t)((ulong)prVar3[uVar8] * (ulong)(uint)-iVar7 >> 0x20);
      iVar10 = (int)((ulong)wrk->fxy_scale * (ulong)(prVar2[uVar8] - rVar9) + 0x80000000 >> 0x20);
      iVar6 = 0xff;
      if (iVar10 < 0x100) {
        iVar6 = iVar10;
      }
      puVar1[uVar8] = (uint8_t)iVar6;
      prVar2[uVar8] = rVar9;
    }
  }
  return;
}

Assistant:

void WebPRescalerExportRowShrink_C(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  const uint32_t yscale = wrk->fy_scale * (-wrk->y_accum);
  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0);
  assert(!wrk->y_expand);
  if (yscale) {
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const uint32_t frac = (uint32_t)MULT_FIX_FLOOR(frow[x_out], yscale);
      const int v = (int)MULT_FIX(irow[x_out] - frac, wrk->fxy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = frac;   // new fractional start
    }
  } else {
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const int v = (int)MULT_FIX(irow[x_out], wrk->fxy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = 0;
    }
  }
}